

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O1

int CVmObjString::const_compare(char *str1,vm_val_t *val)

{
  int iVar1;
  ushort *puVar2;
  
  if (val->typ == VM_OBJ) {
    iVar1 = (**(code **)(*(long *)&G_obj_table_X.pages_[(val->val).obj >> 0xc]
                                   [(val->val).obj & 0xfff].ptr_ + 8))
                      (G_obj_table_X.pages_[(val->val).obj >> 0xc] + ((val->val).obj & 0xfff),
                       CVmObjStringBuffer::metaclass_reg_);
    if (iVar1 != 0) {
      iVar1 = CVmObjStringBuffer::compare_str
                        ((CVmObjStringBuffer *)
                         ((long)&G_obj_table_X.pages_[(val->val).obj >> 0xc]->ptr_ +
                         (ulong)(((val->val).obj & 0xfff) * 0x18)),str1);
      return -iVar1;
    }
  }
  puVar2 = (ushort *)vm_val_t::get_as_string(val);
  if (puVar2 != (ushort *)0x0) {
    iVar1 = utf8_ptr::s_compare_to
                      (str1 + 2,(ulong)*(ushort *)str1,(char *)(puVar2 + 1),(ulong)*puVar2);
    return iVar1;
  }
  err_throw(0x7d9);
}

Assistant:

int CVmObjString::const_compare(VMG_ const char *str1, const vm_val_t *val)
{
    const char *str2;
    size_t len1, len2;

    /* if the other value is a string buffer, compare to its contents */
    if (val->typ == VM_OBJ
        && CVmObjStringBuffer::is_string_buffer_obj(vmg_ val->val.obj))
    {
        /* 
         *   ask the string buffer to do the comparison, but reverse the
         *   sense of the comparison, since from its perspective the
         *   comparison is in the opposite order 
         */
        return -((CVmObjStringBuffer *)vm_objp(vmg_ val->val.obj))
            ->compare_str(str1);
    }

    /* get the other value as a string */
    str2 = val->get_as_string(vmg0_);

    /* if it's not a string, we can't compare it */
    if (str2 == 0)
        err_throw(VMERR_INVALID_COMPARISON);

    /* get the lengths of the two strings */
    len1 = vmb_get_len(str1);
    len2 = vmb_get_len(str2);

    /* perform a lexical comparison and return the result */
    return utf8_ptr::s_compare_to(str1 + VMB_LEN, len1, str2 + VMB_LEN, len2);
}